

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
DefaultSamplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::DefaultSamplings(DefaultSamplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                   *this)

{
  Sampling<tcu::Matrix<float,_2,_2>_> *in0_;
  Sampling<tcu::Matrix<float,_2,_2>_> *in1_;
  Sampling<deqp::gls::BuiltinPrecisionTests::Void> *in2_;
  Sampling<deqp::gls::BuiltinPrecisionTests::Void> *in3_;
  DefaultSamplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  in0_ = &instance<deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,2,2>>>()->
          super_Sampling<tcu::Matrix<float,_2,_2>_>;
  in1_ = &instance<deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,2,2>>>()->
          super_Sampling<tcu::Matrix<float,_2,_2>_>;
  in2_ = &instance<deqp::gls::BuiltinPrecisionTests::DefaultSampling<deqp::gls::BuiltinPrecisionTests::Void>>
                    ()->super_Sampling<deqp::gls::BuiltinPrecisionTests::Void>;
  in3_ = &instance<deqp::gls::BuiltinPrecisionTests::DefaultSampling<deqp::gls::BuiltinPrecisionTests::Void>>
                    ()->super_Sampling<deqp::gls::BuiltinPrecisionTests::Void>;
  Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Samplings(&this->
               super_Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
              ,in0_,in1_,in2_,in3_);
  return;
}

Assistant:

DefaultSamplings	(void)
		: Samplings<In>(instance<DefaultSampling<typename In::In0> >(),
						instance<DefaultSampling<typename In::In1> >(),
						instance<DefaultSampling<typename In::In2> >(),
						instance<DefaultSampling<typename In::In3> >()) {}